

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O3

void __thiscall
AssertionTest_assertFalseHandlerShouldNotBeCalled_Test::TestBody
          (AssertionTest_assertFalseHandlerShouldNotBeCalled_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_28;
  AssertHelper local_20;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_18,"0","assertionHandlerCounter_",(int *)&local_28,
             &(this->super_AssertionTest).assertionHandlerCounter_);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message(&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.ss_.ptr_._4_4_,local_28.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(AssertionTest, assertFalseHandlerShouldNotBeCalled)
{
    bool condition = false;
    CPP_ASSERT_FALSE(condition);
    EXPECT_EQ(0, assertionHandlerCounter_);
}